

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

ssize_t __thiscall
libchars::terminal_driver::write(terminal_driver *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  int *piVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  if (0 < (long)__buf) {
    pvVar3 = (void *)((long)__buf + (long)__buf_00);
    do {
      sVar1 = ::write(this->fd_w,__buf_00,(long)pvVar3 - (long)__buf_00);
      if (sVar1 < 1) {
        if (sVar1 == 0) {
          return 0xffffffff;
        }
        piVar2 = __errno_location();
        if ((*piVar2 != 0xb) && (*piVar2 != 4)) {
          return 0xffffffff;
        }
      }
      else {
        __buf_00 = (void *)((long)__buf_00 + sVar1);
      }
    } while (__buf_00 < pvVar3);
  }
  return 0;
}

Assistant:

int terminal_driver::write(const char *sequence, size_t seqlen)
    {
        const char *const seqend = sequence + seqlen;

        while (sequence < seqend) {
            ssize_t n = ::write(fd_w, sequence, (size_t)(seqend - sequence));
            if (n > 0) {
                sequence += n;
            }
            else {
                if (n == 0)
                    return -1;
                if (errno != EINTR && errno != EWOULDBLOCK)
                    return -1;
            }
        }
        return 0;
    }